

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_enc_Utf16Dfa.h
# Opt level: O0

Utf16DfaBase<axl::enc::Utf16ReverseDfaTable,_axl::sl::False> __thiscall
axl::enc::Utf16DfaBase<axl::enc::Utf16ReverseDfaTable,_axl::sl::False>::decode
          (Utf16DfaBase<axl::enc::Utf16ReverseDfaTable,_axl::sl::False> *this,uint16_t c)

{
  bool bVar1;
  uint state;
  uint cp_00;
  ushort in_SI;
  Utf16DfaBase<axl::enc::Utf16ReverseDfaTable,_axl::sl::False> *in_RDI;
  utf32_t cp;
  uint_t nextState;
  uint_t cc;
  False local_21;
  uint local_20;
  False local_19;
  uint local_18;
  ushort local_12;
  UtfDfa<axl::enc::Utf16ReverseDfaTable,_axl::enc::Utf16CcMap> local_8;
  
  local_12 = in_SI;
  bVar1 = sl::False::operator()(&local_19);
  if (bVar1) {
    state = local_12 & 0xff;
  }
  else {
    state = (int)(uint)local_12 >> 8;
  }
  local_18 = (uint)(byte)Utf16CcMap::m_map[(int)state];
  local_20 = (uint)(byte)Utf16ReverseDfaTable::m_dfa
                         [(in_RDI->super_Utf16ReverseDfaTable).
                          super_UtfDfa<axl::enc::Utf16ReverseDfaTable,_axl::enc::Utf16CcMap>.m_state
                          + local_18];
  bVar1 = sl::False::operator()(&local_21);
  if (bVar1) {
    local_12 = sl::swapByteOrder16(0);
  }
  if (local_20 == 0x18) {
    cp_00 = (uint)local_12 * 0x400 + -0x35fdc00 +
            (in_RDI->super_Utf16ReverseDfaTable).
            super_UtfDfa<axl::enc::Utf16ReverseDfaTable,_axl::enc::Utf16CcMap>.m_cp;
  }
  else {
    cp_00 = (uint)local_12;
  }
  Utf16DfaBase(in_RDI,state,cp_00);
  return (Utf16DfaBase<axl::enc::Utf16ReverseDfaTable,_axl::sl::False>)local_8;
}

Assistant:

Utf16DfaBase<DfaTable, IsBigEndian>
Utf16DfaBase<DfaTable, IsBigEndian>::decode(uint16_t c) {
	uint_t cc = DfaTable::m_map[IsBigEndian()() ? c & 0xff : c >> 8];
	uint_t nextState = DfaTable::m_dfa[this->m_state + cc];

	if (IsBigEndian()())
		c = sl::swapByteOrder16(c);

	utf32_t cp = nextState == DfaTable::State_ReadyPair ? DfaTable::IsReverse ?
		0x10000 - (0xd800 << 10) - 0xdc00 + (c << 10) + this->m_cp :
		0x10000 - (0xd800 << 10) - 0xdc00 + (this->m_cp << 10) + c :
		c;

	return Utf16DfaBase(nextState, cp);
}